

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutBase.cpp
# Opt level: O2

void __thiscall cursespp::LayoutBase::FocusNext(LayoutBase *this)

{
  FocusNext(this);
  return;
}

Assistant:

IWindowPtr LayoutBase::FocusNext() {
    sigslot::signal1<FocusDirection>* notify = nullptr;

    /* GetFocus() will return the focused Window recursively. once we know
    what it is, see if it can focus next. if it cannot, see if its parent
    can, and so on, until we reach ourselves. reaching ourself is the base
    case, and we drop through to the actual focus logic below.

    NOTE: IF YOU UPDATE THIS LOGIC, ALSO UPDATE THE CORRESPONDING CODE IN
    LayoutBase::FocusPrev() */
    auto currFocus = this->GetFocus().get();
    if (currFocus) {
        do {
            auto asLayout = dynamic_cast<LayoutBase*>(currFocus);
            if (asLayout) {
                auto nextFocus = asLayout->FocusNext();
                if (nextFocus) {
                    if (notify) {
                        (*notify)(FocusForward);
                    }
                    return nextFocus;
                }
            }

            Window* parent = (Window*) currFocus->GetParent();
            if (parent == this) { /* base case / stop condition. this should always be hit */
                break;
            }
            currFocus = parent;
        } while (true);
    }

    /*** actual focus logic starts here ***/

    if (this->focused == NO_FOCUS && this->focusMode == FocusModeTerminating) {
        /* nothing. we're already terminated. */
        notify = &FocusTerminated;
    }
    else {
        ++this->focused;
        if (this->focused >= (int) this->focusable.size()) {
            if (this->focusMode == FocusModeCircular) {
                this->focused = 0;
                notify = &FocusWrapped;
            }
            else {
                this->focused = NO_FOCUS;
                notify = &FocusTerminated;
            }
        }
    }

    this->EnsureValidFocusFromNext();

    if (notify) {
        (*notify)(FocusForward);
    }

    return this->GetFocus();
}